

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O0

Expression * __thiscall
soul::StructuralParser::parseSubscriptWithBrackets(StructuralParser *this,Expression *lhs)

{
  bool bVar1;
  Constant *pCVar2;
  SubscriptWithBrackets *pSVar3;
  Expression *pEVar4;
  pool_ptr<soul::AST::Expression> local_128;
  pool_ptr<soul::AST::Expression> local_120;
  pool_ptr<soul::AST::Expression> local_118;
  pool_ptr<soul::AST::Expression> local_110;
  pool_ptr<soul::AST::Expression> local_108;
  char *local_100;
  char *local_f8;
  Expression *local_f0;
  Expression *start_1;
  pool_ptr<soul::AST::Expression> local_e0;
  char *local_d8;
  pool_ptr<soul::AST::Expression> local_d0;
  pool_ptr<soul::AST::Expression> local_c8;
  pool_ptr<soul::AST::Expression> local_c0;
  pool_ptr<soul::AST::Expression> local_b8;
  char *local_b0;
  Value local_a8;
  Constant *local_68;
  Constant *start;
  char *local_50;
  pool_ptr<soul::AST::Expression> local_48;
  pool_ptr<soul::AST::Expression> end;
  pool_ptr<soul::AST::Expression> e;
  Context context;
  Expression *lhs_local;
  StructuralParser *this_local;
  
  getContext((Context *)&e,this);
  pool_ptr<soul::AST::Expression>::pool_ptr(&end);
  pool_ptr<soul::AST::Expression>::pool_ptr(&local_48);
  local_50 = ":";
  bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x4ae19c);
  if (bVar1) {
    soul::Value::createArrayIndex<int>(&local_a8,0);
    pCVar2 = allocate<soul::AST::Constant,soul::AST::Context&,soul::Value>
                       (this,(Context *)&e,&local_a8);
    soul::Value::~Value(&local_a8);
    local_b0 = "]";
    local_68 = pCVar2;
    bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
            ::matches(&this->super_SOULTokeniser,(TokenType)0x4d398a);
    if (!bVar1) {
      pEVar4 = parseExpression(this,false);
      pool_ptr<soul::AST::Expression>::pool_ptr<soul::AST::Expression,void>(&local_b8,pEVar4);
      local_48.object = local_b8.object;
      pool_ptr<soul::AST::Expression>::~pool_ptr(&local_b8);
    }
    pool_ptr<soul::AST::Expression>::pool_ptr<soul::AST::Constant,void>(&local_c8,local_68);
    local_d0.object = local_48.object;
    pEVar4 = checkAndCreateArrayElementRef(this,(Context *)&e,lhs,&local_c8,&local_d0);
    pool_ptr<soul::AST::Expression>::pool_ptr<soul::AST::Expression,void>(&local_c0,pEVar4);
    end.object = local_c0.object;
    pool_ptr<soul::AST::Expression>::~pool_ptr(&local_c0);
    pool_ptr<soul::AST::Expression>::~pool_ptr(&local_d0);
    pool_ptr<soul::AST::Expression>::~pool_ptr(&local_c8);
  }
  else {
    local_d8 = "]";
    bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
            ::matches(&this->super_SOULTokeniser,(TokenType)0x4d398a);
    if (bVar1) {
      start_1 = (Expression *)0x0;
      pSVar3 = allocate<soul::AST::SubscriptWithBrackets,soul::AST::Context&,soul::AST::Expression&,decltype(nullptr)>
                         (this,(Context *)&e,lhs,&start_1);
      pool_ptr<soul::AST::Expression>::pool_ptr<soul::AST::SubscriptWithBrackets,void>
                (&local_e0,pSVar3);
      end.object = local_e0.object;
      pool_ptr<soul::AST::Expression>::~pool_ptr(&local_e0);
    }
    else {
      local_f0 = parseExpression(this,false);
      local_f8 = ":";
      bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
              ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x4ae19c);
      if (bVar1) {
        local_100 = "]";
        bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                ::matches(&this->super_SOULTokeniser,(TokenType)0x4d398a);
        if (!bVar1) {
          pEVar4 = parseExpression(this,false);
          pool_ptr<soul::AST::Expression>::pool_ptr<soul::AST::Expression,void>(&local_108,pEVar4);
          local_48.object = local_108.object;
          pool_ptr<soul::AST::Expression>::~pool_ptr(&local_108);
        }
        pool_ptr<soul::AST::Expression>::pool_ptr<soul::AST::Expression,void>(&local_118,local_f0);
        local_120.object = local_48.object;
        pEVar4 = checkAndCreateArrayElementRef(this,(Context *)&e,lhs,&local_118,&local_120);
        pool_ptr<soul::AST::Expression>::pool_ptr<soul::AST::Expression,void>(&local_110,pEVar4);
        end.object = local_110.object;
        pool_ptr<soul::AST::Expression>::~pool_ptr(&local_110);
        pool_ptr<soul::AST::Expression>::~pool_ptr(&local_120);
        pool_ptr<soul::AST::Expression>::~pool_ptr(&local_118);
      }
      else {
        pSVar3 = allocate<soul::AST::SubscriptWithBrackets,soul::AST::Context&,soul::AST::Expression&,soul::AST::Expression&>
                           (this,(Context *)&e,lhs,local_f0);
        pool_ptr<soul::AST::Expression>::pool_ptr<soul::AST::SubscriptWithBrackets,void>
                  (&local_128,pSVar3);
        end.object = local_128.object;
        pool_ptr<soul::AST::Expression>::~pool_ptr(&local_128);
      }
    }
  }
  bVar1 = Tokeniser<soul::Keyword::Matcher,soul::StandardOperatorMatcher,soul::StandardIdentifierMatcher>
          ::matchAndReplaceIf<soul::TokenType,soul::TokenType>
                    ((Tokeniser<soul::Keyword::Matcher,soul::StandardOperatorMatcher,soul::StandardIdentifierMatcher>
                      *)this,(TokenType)0x4aea03,(TokenType)0x4d398a);
  if (bVar1) {
    pEVar4 = pool_ptr<soul::AST::Expression>::operator*(&end);
    this_local = (StructuralParser *)parseSuffixes(this,pEVar4);
  }
  else {
    Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
    ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x4d398a);
    pEVar4 = pool_ptr<soul::AST::Expression>::operator*(&end);
    this_local = (StructuralParser *)parseSuffixes(this,pEVar4);
  }
  pool_ptr<soul::AST::Expression>::~pool_ptr(&local_48);
  pool_ptr<soul::AST::Expression>::~pool_ptr(&end);
  AST::Context::~Context((Context *)&e);
  return (Expression *)this_local;
}

Assistant:

AST::Expression& parseSubscriptWithBrackets (AST::Expression& lhs)
    {
        auto context = getContext();
        pool_ptr<AST::Expression> e, end;

        if (matchIf (Operator::colon))
        {
            auto& start = allocate<AST::Constant> (context, Value::createArrayIndex (0));

            if (! matches (Operator::closeBracket))
                end = parseExpression();

            e = checkAndCreateArrayElementRef (context, lhs, start, end);
        }
        else if (matches (Operator::closeBracket))
        {
            e = allocate<AST::SubscriptWithBrackets> (context, lhs, nullptr);
        }
        else
        {
            auto& start = parseExpression();

            if (matchIf (Operator::colon))
            {
                if (! matches (Operator::closeBracket))
                    end = parseExpression();

                e = checkAndCreateArrayElementRef (context, lhs, start, end);
            }
            else
            {
                e = allocate<AST::SubscriptWithBrackets> (context, lhs, start);
            }
        }

        if (matchAndReplaceIf (Operator::closeDoubleBracket, Operator::closeBracket))
            return parseSuffixes (*e);

        expect (Operator::closeBracket);
        return parseSuffixes (*e);
    }